

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.cc
# Opt level: O0

void __thiscall Monitor::print(Monitor *this,Stats *stats)

{
  int iVar1;
  pointer pvVar2;
  size_type __maxsize;
  tm *__tp;
  ostream *poVar3;
  long in_RSI;
  float fVar4;
  stringstream ss;
  array<char,_128UL> tsbuf;
  time_t t;
  float packetWidth;
  rep sec;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc00;
  string local_2b8 [36];
  int local_294;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  int local_270;
  allocator local_269;
  string local_268 [48];
  stringstream local_238 [16];
  ostream local_228 [376];
  array<char,_128UL> local_b0;
  time_t local_30;
  float local_24;
  duration<long,_std::ratio<1L,_1L>_> local_20;
  rep local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000l>>
                                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffbd8
                                );
  local_18 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_20);
  fVar4 = log10f((float)(local_18 * 0x3c));
  local_24 = ceilf(fVar4);
  local_30 = time((time_t *)0x0);
  pvVar2 = std::array<char,_128UL>::data((array<char,_128UL> *)0x195c12);
  __maxsize = std::array<char,_128UL>::size(&local_b0);
  __tp = gmtime(&local_30);
  strftime(pvVar2,__maxsize,"%Y-%m-%dT%H:%M:%SZ",__tp);
  std::__cxx11::stringstream::stringstream(local_238);
  std::ostream::operator<<(local_228,std::fixed);
  pvVar2 = std::array<char,_128UL>::data((array<char,_128UL> *)0x195c9b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,pvVar2,&local_269);
  poVar3 = std::operator<<(local_228,local_268);
  std::operator<<(poVar3," [monitor] ");
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  poVar3 = std::operator<<(local_228,"gain: ");
  local_270 = (int)std::setprecision(2);
  poVar3 = std::operator<<(poVar3,(_Setprecision)local_270);
  local_274 = (int)std::setw(5);
  poVar3 = std::operator<<(poVar3,(_Setw)local_274);
  fVar4 = anon_unknown.dwarf_61d39::avg<float>
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar4);
  std::operator<<(poVar3,", ");
  poVar3 = std::operator<<(local_228,"freq: ");
  local_278 = (int)std::setprecision(1);
  poVar3 = std::operator<<(poVar3,(_Setprecision)local_278);
  local_27c = (int)std::setw(7);
  poVar3 = std::operator<<(poVar3,(_Setw)local_27c);
  fVar4 = anon_unknown.dwarf_61d39::avg<float>
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar4);
  std::operator<<(poVar3,", ");
  poVar3 = std::operator<<(local_228,"omega: ");
  local_280 = (int)std::setprecision(3);
  poVar3 = std::operator<<(poVar3,(_Setprecision)local_280);
  local_284 = (int)std::setw(5);
  poVar3 = std::operator<<(poVar3,(_Setw)local_284);
  fVar4 = anon_unknown.dwarf_61d39::avg<float>
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar4);
  std::operator<<(poVar3,", ");
  poVar3 = std::operator<<(local_228,"vit(avg): ");
  local_288 = (int)std::setw(4);
  poVar3 = std::operator<<(poVar3,(_Setw)local_288);
  iVar1 = anon_unknown.dwarf_61d39::avg<int>(in_stack_fffffffffffffbd8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::operator<<(poVar3,", ");
  poVar3 = std::operator<<(local_228,"rs(sum): ");
  local_28c = (int)std::setw(4);
  poVar3 = std::operator<<(poVar3,(_Setw)local_28c);
  iVar1 = anon_unknown.dwarf_61d39::sum<int>(in_stack_fffffffffffffc00);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::operator<<(poVar3,", ");
  poVar3 = std::operator<<(local_228,"packets: ");
  local_290 = (int)std::setw((int)local_24);
  poVar3 = std::operator<<(poVar3,(_Setw)local_290);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(local_10 + 0x78));
  std::operator<<(poVar3,", ");
  poVar3 = std::operator<<(local_228,"drops: ");
  local_294 = (int)std::setw((int)local_24);
  poVar3 = std::operator<<(poVar3,(_Setw)local_294);
  std::ostream::operator<<(poVar3,*(int *)(local_10 + 0x7c));
  std::__cxx11::stringstream::str();
  poVar3 = std::operator<<((ostream *)&std::cout,local_2b8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::stringstream::~stringstream(local_238);
  return;
}

Assistant:

void Monitor::print(const Stats& stats) {
  auto sec = std::chrono::duration_cast<std::chrono::seconds>(interval_).count();

  // Upper bound of 60 packets per second (HRIT)
  const auto packetWidth = ceilf(log10f(sec * 60));

  // std::put_time is not available in GCC < 5
  std::time_t t = std::time(nullptr);
  std::array<char, 128> tsbuf;
  strftime(tsbuf.data(), tsbuf.size(), "%Y-%m-%dT%H:%M:%SZ", std::gmtime(&t));

  std::stringstream ss;
  ss << std::fixed;
  ss << std::string(tsbuf.data())
     << " [monitor] ";
  ss << "gain: "
     << std::setprecision(2) << std::setw(5)
     << avg(stats.gain) << ", ";
  ss << "freq: "
     << std::setprecision(1) << std::setw(7)
     << avg(stats.frequency) << ", ";
  ss << "omega: "
     << std::setprecision(3) << std::setw(5)
     << avg(stats.omega) << ", ";
  ss << "vit(avg): "
     << std::setw(4)
     << avg(stats.viterbiErrors) << ", ";
  ss << "rs(sum): "
     << std::setw(4)
     << sum(stats.reedSolomonErrors) << ", ";
  ss << "packets: "
     << std::setw(packetWidth)
     << stats.totalOK << ", ";
  ss << "drops: "
     << std::setw(packetWidth)
     << stats.totalDropped;
  std::cout << ss.str() << std::endl;
}